

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * Catch::clara::detail::convertInto<long>(string *source,long *target)

{
  byte bVar1;
  long *in_RDX;
  string *in_RSI;
  ParserResult *in_RDI;
  stringstream ss;
  string *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  ParserResult *__lhs;
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  long *local_18;
  string *local_10;
  
  __lhs = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::operator<<(local_190,local_10);
  ::std::istream::operator>>((istream *)local_1a0,local_18);
  bVar1 = ::std::ios::fail();
  if ((bVar1 & 1) == 0) {
    BasicResult<Catch::clara::detail::ParseResultType>::ok<Catch::clara::detail::ParseResultType>
              ((ParseResultType *)in_stack_fffffffffffffde8);
  }
  else {
    ::std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)CONCAT17(bVar1,in_stack_fffffffffffffdf0));
    BasicResult<Catch::clara::detail::ParseResultType>::runtimeError(in_stack_fffffffffffffde8);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
    ::std::__cxx11::string::~string(local_1f0);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

inline auto convertInto( std::string const &source, T& target ) -> ParserResult {
        std::stringstream ss;
        ss << source;
        ss >> target;
        if( ss.fail() )
            return ParserResult::runtimeError( "Unable to convert '" + source + "' to destination type" );
        else
            return ParserResult::ok( ParseResultType::Matched );
    }